

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall FSlide::HitSlideLine(FSlide *this,line_t *ld)

{
  DVector2 *this_00;
  bool bVar1;
  int iVar2;
  FSoundID *sound_id;
  AActor *pAVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  DVector2 DVar8;
  FSoundID local_94;
  FSoundID local_90;
  FSoundID local_8c;
  divline_t local_88;
  divline_t local_68;
  DVector3 pos;
  
  dVar4 = (this->tmmove).X;
  dVar5 = (this->tmmove).Y;
  if (((dVar5 * dVar5 + dVar4 * dVar4 <= 16.0) || (!var_friction.Value)) ||
     (pAVar3 = this->slidemo, pAVar3->floorz < (pAVar3->__Pos).Z)) {
    bVar1 = false;
  }
  else {
    dVar4 = P_GetFriction(pAVar3,(double *)0x0);
    bVar1 = 0.90625 < dVar4;
  }
  this_00 = &this->tmmove;
  dVar4 = (ld->delta).X;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar4 = (ld->delta).Y;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      AActor::PosRelative(&pos,this->slidemo,ld);
      local_88.x = pos.X;
      local_88.y = pos.Y;
      iVar2 = P_PointOnLineSide((DVector2 *)&local_88,ld);
      local_88.x = (ld->delta).X;
      local_88.y = (ld->delta).Y;
      TVector2<double>::Angle((TVector2<double> *)&local_68);
      if (iVar2 == 1) {
        local_68.x = local_68.x + 180.0;
      }
      TVector2<double>::Angle((TVector2<double> *)&local_88);
      dVar4 = (double)SUB84(((local_88.x + 3600.0) - local_68.x) * 11930464.711111112 +
                            6755399441055744.0,0) * 8.381903171539307e-08;
      dVar5 = TVector2<double>::Length(this_00);
      if ((bool)(bVar1 & (45.0 < dVar4 && dVar4 < 135.0))) {
        local_68.x = (double)SUB84((local_68.x - dVar4) * 11930464.711111112 + 6755399441055744.0,0)
                     * 8.381903171539307e-08;
        pAVar3 = this->slidemo;
        if (((pAVar3->player != (player_t *)0x0) && (0 < pAVar3->health)) &&
           ((pAVar3->player->cheats & 0x2000) == 0)) {
          local_94.ID = S_FindSound("*grunt");
          S_Sound(pAVar3,2,&local_94,1.0,1.001);
        }
        TAngle<double>::ToVector((TAngle<double> *)&local_88,dVar5 * 0.5);
        this_00->X = local_88.x;
        (this->tmmove).Y = local_88.y;
        return;
      }
      local_88.x = (ld->v1->p).X;
      local_88.y = (ld->v1->p).Y;
      local_88.dx = (ld->delta).X;
      local_88.dy = (ld->delta).Y;
      local_68.x = pos.X;
      local_68.y = pos.Y;
      local_68.dy = -local_88.dx;
      local_68.dx = local_88.dy;
      dVar4 = P_InterceptVector(&local_88,&local_68);
      local_68.dx = this_00->X;
      local_68.dy = (this->tmmove).Y;
      dVar5 = P_InterceptVector(&local_88,&local_68);
      auVar6._0_8_ = P_InterceptVector(&local_68,&local_88);
      if ((auVar6._0_8_ == 0.0) && (!NAN(auVar6._0_8_))) {
        this_00->X = 0.0;
        (this->tmmove).Y = 0.0;
        return;
      }
      auVar7._0_8_ = (dVar5 - dVar4) * local_88.dx;
      auVar7._8_8_ = (dVar5 - dVar4) * local_88.dy;
      auVar6._8_8_ = auVar6._0_8_;
      DVar8 = (DVector2)divpd(auVar7,auVar6);
      *this_00 = DVar8;
      return;
    }
    if (bVar1) {
      dVar4 = (this->tmmove).Y;
      if (ABS(this_00->X) < ABS(dVar4)) {
        (this->tmmove).X = this_00->X * 0.5;
        (this->tmmove).Y = dVar4 * -0.5;
        pAVar3 = this->slidemo;
        if (pAVar3->player == (player_t *)0x0) {
          return;
        }
        if (pAVar3->health < 1) {
          return;
        }
        if ((pAVar3->player->cheats & 0x2000) != 0) {
          return;
        }
        iVar2 = S_FindSound("*grunt");
        sound_id = &local_90;
        goto LAB_004ae78b;
      }
    }
    (this->tmmove).Y = 0.0;
  }
  else {
    if (bVar1) {
      dVar4 = (this->tmmove).Y;
      if (ABS(dVar4) < ABS(this_00->X)) {
        (this->tmmove).X = this_00->X * -0.5;
        (this->tmmove).Y = dVar4 * 0.5;
        pAVar3 = this->slidemo;
        if (pAVar3->player == (player_t *)0x0) {
          return;
        }
        if (pAVar3->health < 1) {
          return;
        }
        if ((pAVar3->player->cheats & 0x2000) != 0) {
          return;
        }
        iVar2 = S_FindSound("*grunt");
        sound_id = &local_8c;
LAB_004ae78b:
        sound_id->ID = iVar2;
        S_Sound(pAVar3,2,sound_id,1.0,1.001);
        return;
      }
    }
    this_00->X = 0.0;
  }
  return;
}

Assistant:

void FSlide::HitSlideLine(line_t* ld)
{
	int 	side;

	DAngle lineangle;
	DAngle moveangle;
	DAngle deltaangle;

	double movelen;
	bool	icyfloor;	// is floor icy?							// phares
	//   |
	// Under icy conditions, if the angle of approach to the wall	//   V
	// is more than 45 degrees, then you'll bounce and lose half
	// your velocity. If less than 45 degrees, you'll slide along
	// the wall. 45 is arbitrary and is believable.

	// Check for the special cases of horz or vert walls.

	// killough 10/98: only bounce if hit hard (prevents wobbling)
	icyfloor =
		tmmove.LengthSquared() > 4*4 &&
		var_friction &&  // killough 8/28/98: calc friction on demand
		slidemo->Z() <= slidemo->floorz &&
		P_GetFriction(slidemo, NULL) > ORIG_FRICTION;

	if (ld->Delta().X == 0)
	{ // ST_VERTICAL
		if (icyfloor && (fabs(tmmove.X) > fabs(tmmove.Y)))
		{
			tmmove.X = -tmmove.X / 2;
			tmmove.Y /= 2; // absorb half the velocity
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!//   ^
			}
		}																		//   |
		else																	// phares
			tmmove.X = 0; // no more movement in the X direction
		return;
	}

	if (ld->Delta().Y == 0)
	{ // ST_HORIZONTAL
		if (icyfloor && (fabs(tmmove.Y) > fabs(tmmove.X)))
		{
			tmmove.X /= 2; // absorb half the velocity
			tmmove.Y = -tmmove.Y / 2;
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
			}
		}
		else
			tmmove.Y = 0; // no more movement in the Y direction
		return;
	}

	// The wall is angled. Bounce if the angle of approach is		// phares
	// less than 45 degrees.										// phares

	DVector3 pos = slidemo->PosRelative(ld);
	side = P_PointOnLineSide(pos, ld);

	lineangle = ld->Delta().Angle();

	if (side == 1)
		lineangle += 180.;

	moveangle = tmmove.Angle();

	// prevents sudden path reversal due to rounding error |	// phares
	moveangle += 3600/65536.*65536.;		// Boom added 10 to the angle here.
	
	deltaangle = ::deltaangle(lineangle, moveangle);								//   V
	movelen = tmmove.Length();
	if (icyfloor && (deltaangle > 45) && (deltaangle < 135))
	{
		moveangle = ::deltaangle(deltaangle, lineangle);
		movelen /= 2; // absorb
		if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
		{
			S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
		}
		tmmove = moveangle.ToVector(movelen);
	}	
	else
	{	
		// The compatibility option that used to be here had to be removed because
		// with floating point math it was no longer possible to reproduce.

#if 0
		// with full precision this should work now. Needs some testing
		if (deltaangle < 0)	deltaangle += 180.;
		tmmove = lineangle.ToVector(movelen * deltaangle.Cos());
#else
		divline_t dll, dlv;
		double inter1, inter2, inter3;

		P_MakeDivline(ld, &dll);

		dlv.x = pos.X;
		dlv.y = pos.Y;
		dlv.dx = dll.dy;
		dlv.dy = -dll.dx;

		inter1 = P_InterceptVector(&dll, &dlv);

		dlv.dx = tmmove.X;
		dlv.dy = tmmove.Y;
		inter2 = P_InterceptVector(&dll, &dlv);
		inter3 = P_InterceptVector(&dlv, &dll);

		if (inter3 != 0)
		{
			tmmove.X = (inter2 - inter1) * dll.dx / inter3;
			tmmove.Y = (inter2 - inter1) * dll.dy / inter3;
		}
		else
		{
			tmmove.Zero();
		}
#endif
	}																// phares
}